

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

string * __thiscall
cmLocalUnixMakefileGenerator3::MakeLauncher_abi_cxx11_
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,
          cmCustomCommandGenerator *ccg,cmGeneratorTarget *target,RelativeRoot relative)

{
  bool bVar1;
  char *pcVar2;
  const_reference source;
  ulong uVar3;
  string local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs;
  string output;
  RuleVariables vars;
  allocator local_61;
  string local_60;
  char *local_40;
  char *val;
  char *prop;
  cmGeneratorTarget *pcStack_28;
  RelativeRoot relative_local;
  cmGeneratorTarget *target_local;
  cmCustomCommandGenerator *ccg_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  string *launcher;
  
  val = "RULE_LAUNCH_CUSTOM";
  prop._4_4_ = relative;
  pcStack_28 = target;
  target_local = (cmGeneratorTarget *)ccg;
  ccg_local = (cmCustomCommandGenerator *)this;
  this_local = (cmLocalUnixMakefileGenerator3 *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"RULE_LAUNCH_CUSTOM",&local_61);
  pcVar2 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)this,target,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_40 = pcVar2;
  if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"",(allocator *)((long)&vars.FilterPrefix + 3));
    std::allocator<char>::~allocator((allocator<char> *)((long)&vars.FilterPrefix + 3));
  }
  else {
    cmLocalGenerator::RuleVariables::RuleVariables((RuleVariables *)((long)&output.field_2 + 8));
    vars.Includes = val;
    output.field_2._8_8_ = pcStack_28;
    std::__cxx11::string::string((string *)&outputs);
    local_188 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                          ((cmCustomCommandGenerator *)target_local);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(local_188);
    if (!bVar1) {
      source = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_188,0);
      cmOutputConverter::Convert
                (&local_1a8,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,source,prop._4_4_,SHELL);
      std::__cxx11::string::operator=((string *)&outputs,(string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
    }
    vars.PreprocessedSource = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    cmLocalGenerator::ExpandRuleVariables
              ((cmLocalGenerator *)this,__return_storage_ptr__,
               (RuleVariables *)((long)&output.field_2 + 8));
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ");
    }
    std::__cxx11::string::~string((string *)&outputs);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
cmLocalUnixMakefileGenerator3::MakeLauncher(
  cmCustomCommandGenerator const& ccg,
  cmGeneratorTarget* target, RelativeRoot relative)
{
  // Short-circuit if there is no launcher.
  const char* prop = "RULE_LAUNCH_CUSTOM";
  const char* val = this->GetRuleLauncher(target, prop);
  if(!(val && *val))
    {
    return "";
    }

  // Expand rules in the empty string.  It may insert the launcher and
  // perform replacements.
  RuleVariables vars;
  vars.RuleLauncher = prop;
  vars.CMTarget = target;
  std::string output;
  const std::vector<std::string>& outputs = ccg.GetOutputs();
  if(!outputs.empty())
    {
    output = this->Convert(outputs[0], relative, SHELL);
    }
  vars.Output = output.c_str();

  std::string launcher;
  this->ExpandRuleVariables(launcher, vars);
  if(!launcher.empty())
    {
    launcher += " ";
    }
  return launcher;
}